

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::LoadStoreInst::display(LoadStoreInst *this,ostream *o)

{
  add_pointer_t<const_std::__cxx11::basic_string<char>_> ptVar1;
  add_pointer_t<const_arm::MemoryOperand> o_00;
  ostream *in_RSI;
  ostream *in_RDI;
  add_pointer_t<const_arm::MemoryOperand> m_1;
  add_pointer_t<const_std::__cxx11::basic_string<char>_> m;
  undefined8 in_stack_ffffffffffffffe0;
  
  display_op((OpCode)((ulong)in_stack_ffffffffffffffe0 >> 0x20),in_RDI);
  display_cond((ConditionCode)((ulong)in_stack_ffffffffffffffe0 >> 0x38),in_RDI);
  std::operator<<(in_RSI," ");
  display_reg_name((ostream *)m,m_1._4_4_);
  std::operator<<(in_RSI,", ");
  ptVar1 = std::get_if<std::__cxx11::string,std::__cxx11::string,arm::MemoryOperand>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                       *)0x2c6398);
  if (ptVar1 == (add_pointer_t<const_std::__cxx11::basic_string<char>_>)0x0) {
    o_00 = std::get_if<arm::MemoryOperand,std::__cxx11::string,arm::MemoryOperand>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                       *)0x2c63c3);
    if (o_00 != (add_pointer_t<const_arm::MemoryOperand>)0x0) {
      prelude::operator<<((ostream *)o_00,(Displayable *)in_RDI);
    }
  }
  else {
    std::operator<<(in_RSI,(string *)ptVar1);
  }
  return;
}

Assistant:

void LoadStoreInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, rd);
  o << ", ";
  if (auto m = std::get_if<std::string>(&mem)) {
    o << *m;
  } else if (auto m = std::get_if<MemoryOperand>(&mem)) {
    o << *m;
  }
}